

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_on_push_promise_received(nghttp2_session *session,nghttp2_frame *frame)

{
  int iVar1;
  nghttp2_session *session_00;
  nghttp2_stream *pnVar2;
  long in_RSI;
  nghttp2_session *in_RDI;
  void *in_stack_00000008;
  nghttp2_priority_spec pri_spec;
  nghttp2_stream *promised_stream;
  nghttp2_stream *stream;
  nghttp2_session *in_stack_00000028;
  int rv;
  undefined4 in_stack_ffffffffffffffb8;
  int32_t in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  int32_t in_stack_ffffffffffffffc4;
  int32_t in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  nghttp2_frame *in_stack_ffffffffffffffd0;
  nghttp2_session *in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (*(int *)(in_RSI + 8) == 0) {
    iVar1 = session_inflate_handle_invalid_connection
                      (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc
                       ,(char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  }
  else if ((in_RDI->server == '\0') && ((in_RDI->local_settings).enable_push != 0)) {
    iVar1 = nghttp2_session_is_my_stream_id(in_RDI,*(int32_t *)(in_RSI + 8));
    if (iVar1 == 0) {
      iVar1 = session_inflate_handle_invalid_connection
                        (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                         in_stack_ffffffffffffffcc,
                         (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    }
    else {
      iVar1 = session_allow_incoming_new_stream(in_RDI);
      if (iVar1 == 0) {
        iVar1 = -0x67;
      }
      else {
        iVar1 = session_is_new_peer_stream_id
                          ((nghttp2_session *)
                           CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                           in_stack_ffffffffffffffbc);
        if (iVar1 == 0) {
          iVar1 = session_inflate_handle_invalid_connection
                            (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                             in_stack_ffffffffffffffcc,
                             (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
        }
        else {
          iVar1 = session_detect_idle_stream
                            ((nghttp2_session *)
                             CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
          if (iVar1 == 0) {
            in_RDI->last_recv_stream_id = *(int32_t *)(in_RSI + 0x28);
            session_00 = (nghttp2_session *)
                         nghttp2_session_get_stream
                                   ((nghttp2_session *)
                                    CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                                    in_stack_ffffffffffffffc4);
            if ((((session_00 == (nghttp2_session *)0x0) ||
                 ((session_00->root).remote_window_size == 3)) ||
                (in_RDI->pending_enable_push == '\0')) ||
               (in_RDI->max_incoming_reserved_streams <= in_RDI->num_incoming_reserved_streams)) {
              iVar1 = nghttp2_session_add_rst_stream
                                ((nghttp2_session *)
                                 CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                 (int32_t)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI);
              if (iVar1 == 0) {
                iVar1 = -0x67;
              }
            }
            else if (((session_00->root).recv_reduction & 0x100) == 0) {
              nghttp2_priority_spec_init
                        ((nghttp2_priority_spec *)&stack0xffffffffffffffc4,
                         *(int32_t *)&(session_00->root).closed_next,0x10,0);
              pnVar2 = nghttp2_session_open_stream
                                 (in_stack_00000028,stream._4_4_,stream._3_1_,
                                  (nghttp2_priority_spec *)promised_stream,pri_spec._8_4_,
                                  in_stack_00000008);
              if (pnVar2 == (nghttp2_stream *)0x0) {
                iVar1 = -0x385;
              }
              else {
                in_RDI->last_proc_stream_id = in_RDI->last_recv_stream_id;
                iVar1 = session_call_on_begin_headers
                                  ((nghttp2_session *)
                                   CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                                   (nghttp2_frame *)
                                   CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
                if (iVar1 == 0) {
                  iVar1 = 0;
                }
              }
            }
            else {
              iVar1 = session_inflate_handle_invalid_connection
                                (session_00,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                                 (char *)CONCAT44(in_stack_ffffffffffffffc4,
                                                  in_stack_ffffffffffffffc0));
            }
          }
          else {
            iVar1 = session_inflate_handle_invalid_connection
                              (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                               in_stack_ffffffffffffffcc,
                               (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                              );
          }
        }
      }
    }
  }
  else {
    iVar1 = session_inflate_handle_invalid_connection
                      (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc
                       ,(char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  }
  return iVar1;
}

Assistant:

int nghttp2_session_on_push_promise_received(nghttp2_session *session,
                                             nghttp2_frame *frame) {
  int rv;
  nghttp2_stream *stream;
  nghttp2_stream *promised_stream;
  nghttp2_priority_spec pri_spec;

  if (frame->hd.stream_id == 0) {
    return session_inflate_handle_invalid_connection(
      session, frame, NGHTTP2_ERR_PROTO, "PUSH_PROMISE: stream_id == 0");
  }
  if (session->server || session->local_settings.enable_push == 0) {
    return session_inflate_handle_invalid_connection(
      session, frame, NGHTTP2_ERR_PROTO, "PUSH_PROMISE: push disabled");
  }

  if (!nghttp2_session_is_my_stream_id(session, frame->hd.stream_id)) {
    return session_inflate_handle_invalid_connection(
      session, frame, NGHTTP2_ERR_PROTO, "PUSH_PROMISE: invalid stream_id");
  }

  if (!session_allow_incoming_new_stream(session)) {
    /* We just discard PUSH_PROMISE after GOAWAY was sent */
    return NGHTTP2_ERR_IGN_HEADER_BLOCK;
  }

  if (!session_is_new_peer_stream_id(session,
                                     frame->push_promise.promised_stream_id)) {
    /* The spec says if an endpoint receives a PUSH_PROMISE with
       illegal stream ID is subject to a connection error of type
       PROTOCOL_ERROR. */
    return session_inflate_handle_invalid_connection(
      session, frame, NGHTTP2_ERR_PROTO,
      "PUSH_PROMISE: invalid promised_stream_id");
  }

  if (session_detect_idle_stream(session, frame->hd.stream_id)) {
    return session_inflate_handle_invalid_connection(
      session, frame, NGHTTP2_ERR_PROTO, "PUSH_PROMISE: stream in idle");
  }

  session->last_recv_stream_id = frame->push_promise.promised_stream_id;
  stream = nghttp2_session_get_stream(session, frame->hd.stream_id);
  if (!stream || stream->state == NGHTTP2_STREAM_CLOSING ||
      !session->pending_enable_push ||
      session->num_incoming_reserved_streams >=
        session->max_incoming_reserved_streams) {
    /* Currently, client does not retain closed stream, so we don't
       check NGHTTP2_SHUT_RD condition here. */

    rv = nghttp2_session_add_rst_stream(
      session, frame->push_promise.promised_stream_id, NGHTTP2_CANCEL);
    if (rv != 0) {
      return rv;
    }
    return NGHTTP2_ERR_IGN_HEADER_BLOCK;
  }

  if (stream->shut_flags & NGHTTP2_SHUT_RD) {
    return session_inflate_handle_invalid_connection(
      session, frame, NGHTTP2_ERR_STREAM_CLOSED, "PUSH_PROMISE: stream closed");
  }

  nghttp2_priority_spec_init(&pri_spec, stream->stream_id,
                             NGHTTP2_DEFAULT_WEIGHT, 0);

  promised_stream = nghttp2_session_open_stream(
    session, frame->push_promise.promised_stream_id, NGHTTP2_STREAM_FLAG_NONE,
    &pri_spec, NGHTTP2_STREAM_RESERVED, NULL);

  if (!promised_stream) {
    return NGHTTP2_ERR_NOMEM;
  }

  /* We don't call nghttp2_session_adjust_closed_stream(), since we
     don't keep closed stream in client side */

  session->last_proc_stream_id = session->last_recv_stream_id;
  rv = session_call_on_begin_headers(session, frame);
  if (rv != 0) {
    return rv;
  }
  return 0;
}